

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

string * __thiscall
czh::file::StreamFile::get_name_abi_cxx11_(string *__return_storage_ptr__,StreamFile *this)

{
  StreamFile *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,&(this->super_File).filename);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string get_name() const override
    {
      return filename;
    }